

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Ptr<Catch::TestSpec::Pattern> * __thiscall
Catch::Ptr<Catch::TestSpec::Pattern>::operator=(Ptr<Catch::TestSpec::Pattern> *this,Pattern *p)

{
  Pattern *pPVar1;
  
  if (p != (Pattern *)0x0) {
    (*(p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[2])(p)
    ;
  }
  pPVar1 = this->m_p;
  this->m_p = p;
  if (pPVar1 != (Pattern *)0x0) {
    (*(pPVar1->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
      [3])();
  }
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }